

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O1

int pipeListen(lua_State *L)

{
  bool bVar1;
  char *pcVar2;
  EmmyFacade *this;
  int iVar3;
  string err;
  allocator local_69;
  string local_68;
  string local_48;
  
  (*luaL_checklstring)(L,1,(size_t *)0x0);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (*lua_tolstring)(L,1,(size_t *)0x0);
  this = EmmyFacade::Get();
  std::__cxx11::string::string((string *)&local_48,pcVar2,&local_69);
  bVar1 = EmmyFacade::PipeListen(this,L,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (*lua_pushboolean)(L,SUB14(bVar1,0));
  iVar3 = 1;
  if (!bVar1) {
    iVar3 = 2;
    (*lua_pushstring)(L,local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return iVar3;
}

Assistant:

int pipeListen(lua_State* L)
{
	luaL_checkstring(L, 1);
	std::string err;
	const auto pipeName = lua_tostring(L, 1);
	const auto suc = EmmyFacade::Get().PipeListen(L, pipeName, err);
	lua_pushboolean(L, suc);
	if (suc) return 1;
	lua_pushstring(L, err.c_str());
	return 2;
}